

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

bool __thiscall
MeteomaticsApiClient::readMultiPointTimeSeriesBin
          (MeteomaticsApiClient *this,MemoryClass *mem,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *results,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *times)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  double local_b8;
  double value;
  undefined1 local_a8 [4];
  int32_t k;
  vector<double,_std::allocator<double>_> tmpValues;
  double local_70;
  double t;
  int local_60;
  int32_t nParameter;
  int32_t j;
  undefined1 local_50 [8];
  Matrix tmpMat;
  int local_30;
  int32_t nTimes;
  int32_t i;
  int32_t nCoords;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *times_local;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *results_local;
  MemoryClass *mem_local;
  MeteomaticsApiClient *this_local;
  
  _i = times;
  times_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)results;
  results_local =
       (vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        *)mem;
  mem_local = (MemoryClass *)this;
  MMIntern::MemoryClass::read<int>(mem,&nTimes);
  for (local_30 = 0; local_30 < nTimes; local_30 = local_30 + 1) {
    MMIntern::MemoryClass::read<int>
              ((MemoryClass *)results_local,
               (int *)((long)&tmpMat.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_50);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::reserve((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_50,
              (long)tmpMat.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    for (local_60 = 0;
        local_60 <
        tmpMat.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_60 = local_60 + 1) {
      MMIntern::MemoryClass::read<int>((MemoryClass *)results_local,(int *)((long)&t + 4));
      MMIntern::MemoryClass::read<double>((MemoryClass *)results_local,&local_70);
      this_00 = _i;
      convDateIso8601_abi_cxx11_
                ((MeteomaticsApiClient *)
                 &tmpValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,(value_type *)
                          &tmpValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &tmpValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_a8);
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)local_a8,(long)t._4_4_);
      for (value._4_4_ = 0; value._4_4_ < t._4_4_; value._4_4_ = value._4_4_ + 1) {
        MMIntern::MemoryClass::read<double>((MemoryClass *)results_local,&local_b8);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_a8,&local_b8);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_50,(value_type *)local_a8);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_a8);
    }
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::push_back((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 *)times_local,(value_type *)local_50);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_50);
  }
  return true;
}

Assistant:

bool MeteomaticsApiClient::readMultiPointTimeSeriesBin(MMIntern::MemoryClass& mem, std::vector<Matrix>& results, std::vector<std::string>& times) const
{
    int32_t nCoords;
    mem.read(nCoords);
    
    for (int32_t i=0; i<nCoords; i++)
    {
        int32_t nTimes;
        mem.read(nTimes);
        
        Matrix tmpMat;
        tmpMat.reserve(nTimes);
        for (int32_t j=0; j<nTimes; j++)
        {
            int32_t nParameter;
            mem.read(nParameter);
            
            double t;
            mem.read(t);
            times.push_back(convDateIso8601(t));
            
            std::vector<double> tmpValues;
            tmpValues.reserve(nParameter);
            for (int32_t k=0; k<nParameter; k++)
            {
                double value;
                mem.read(value);
                tmpValues.push_back(value);
            }
            tmpMat.push_back(tmpValues);
        }
        results.push_back(tmpMat);
    }
    
    return true;
}